

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void aom_filter_block1d4_v4_ssse3
               (uint8_t *src_ptr,ptrdiff_t src_pitch,uint8_t *output_ptr,ptrdiff_t out_pitch,
               uint32_t output_height,int16_t *filter)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long in_RCX;
  undefined4 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i srcReg23_34_lo;
  __m128i srcReg56;
  __m128i srcReg6;
  __m128i srcReg45;
  __m128i srcReg5;
  __m128i srcReg34;
  __m128i srcReg4;
  __m128i srcReg23;
  __m128i srcReg3;
  __m128i srcReg2;
  __m128i addFilterReg32;
  __m128i filtersReg;
  undefined4 local_56c;
  undefined4 local_558;
  undefined4 local_548;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4a8;
  undefined8 local_430;
  undefined8 local_420;
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 local_3e8;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_336;
  undefined2 uStack_334;
  undefined2 uStack_332;
  undefined2 local_328;
  undefined2 uStack_326;
  undefined2 uStack_324;
  undefined2 uStack_322;
  undefined1 uStack_164;
  undefined1 uStack_163;
  undefined1 uStack_162;
  undefined1 uStack_161;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  undefined1 uStack_141;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m128i firstFilters;
  __m128i resReghi;
  __m128i resReglo;
  __m128i srcReg2345_3456_hi;
  __m128i srcReg2345_3456_lo;
  __m128i srcReg45_56_lo;
  
  auVar7 = psraw(*in_R9,ZEXT416(1));
  auVar8 = packsswb(auVar7,auVar7);
  auVar7._8_8_ = 0x504030205040302;
  auVar7._0_8_ = 0x504030205040302;
  auVar7 = pshufb(auVar8,auVar7);
  uVar1 = *(undefined8 *)(in_RDI + in_RSI * 2);
  uVar2 = *(undefined8 *)(in_RDI + in_RSI * 3);
  local_4a8 = *(undefined8 *)(in_RDI + in_RSI * 4);
  local_138 = (undefined1)uVar1;
  uStack_137 = (undefined1)((ulong)uVar1 >> 8);
  uStack_136 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_135 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_134 = (undefined1)uVar2;
  uStack_133 = (undefined1)((ulong)uVar2 >> 8);
  uStack_132 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_131 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_144 = (undefined1)local_4a8;
  uStack_143 = (undefined1)((ulong)local_4a8 >> 8);
  uStack_142 = (undefined1)((ulong)local_4a8 >> 0x10);
  uStack_141 = (undefined1)((ulong)local_4a8 >> 0x18);
  local_508 = CONCAT17(uStack_131,
                       CONCAT16(uStack_135,
                                CONCAT15(uStack_132,
                                         CONCAT14(uStack_136,
                                                  CONCAT13(uStack_133,
                                                           CONCAT12(uStack_137,
                                                                    CONCAT11(uStack_134,local_138)))
                                                 ))));
  uStack_500 = CONCAT17(uStack_141,
                        CONCAT16(uStack_131,
                                 CONCAT15(uStack_142,
                                          CONCAT14(uStack_132,
                                                   CONCAT13(uStack_143,
                                                            CONCAT12(uStack_133,
                                                                     CONCAT11(uStack_144,uStack_134)
                                                                    ))))));
  local_430 = in_RDX;
  local_420 = in_RDI;
  for (local_56c = in_R8D; 1 < local_56c; local_56c = local_56c - 2) {
    uVar1 = *(undefined8 *)(local_420 + in_RSI * 5);
    uVar2 = *(undefined8 *)(local_420 + in_RSI * 6);
    local_158 = (undefined1)local_4a8;
    uStack_157 = (undefined1)((ulong)local_4a8 >> 8);
    uStack_156 = (undefined1)((ulong)local_4a8 >> 0x10);
    uStack_155 = (undefined1)((ulong)local_4a8 >> 0x18);
    uStack_154 = (undefined1)uVar1;
    uStack_153 = (undefined1)((ulong)uVar1 >> 8);
    uStack_152 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_151 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_164 = (undefined1)uVar2;
    uStack_163 = (undefined1)((ulong)uVar2 >> 8);
    uStack_162 = (undefined1)((ulong)uVar2 >> 0x10);
    uStack_161 = (undefined1)((ulong)uVar2 >> 0x18);
    uVar3 = CONCAT13(uStack_153,CONCAT12(uStack_157,CONCAT11(uStack_154,local_158)));
    uVar4 = CONCAT15(uStack_152,CONCAT14(uStack_156,uVar3));
    local_328 = (undefined2)local_508;
    uStack_326 = (undefined2)((ulong)local_508 >> 0x10);
    uStack_324 = (undefined2)((ulong)local_508 >> 0x20);
    uStack_322 = (undefined2)((ulong)local_508 >> 0x30);
    uStack_336 = (undefined2)((uint)uVar3 >> 0x10);
    uStack_334 = (undefined2)((uint6)uVar4 >> 0x20);
    uStack_332 = (undefined2)(CONCAT17(uStack_151,CONCAT16(uStack_155,uVar4)) >> 0x30);
    uVar3 = CONCAT13(uStack_163,CONCAT12(uStack_153,CONCAT11(uStack_164,uStack_154)));
    uVar4 = CONCAT15(uStack_162,CONCAT14(uStack_152,uVar3));
    uStack_110 = (undefined2)uStack_500;
    uStack_10e = (undefined2)((ulong)uStack_500 >> 0x10);
    uStack_10c = (undefined2)((ulong)uStack_500 >> 0x20);
    uStack_10a = (undefined2)((ulong)uStack_500 >> 0x30);
    uStack_11e = (undefined2)((uint)uVar3 >> 0x10);
    uStack_11c = (undefined2)((uint6)uVar4 >> 0x20);
    uStack_11a = (undefined2)(CONCAT17(uStack_161,CONCAT16(uStack_151,uVar4)) >> 0x30);
    auVar9._2_2_ = CONCAT11(uStack_154,local_158);
    auVar9._0_2_ = local_328;
    auVar9._4_2_ = uStack_326;
    auVar9._6_2_ = uStack_336;
    auVar9._10_2_ = uStack_334;
    auVar9._8_2_ = uStack_324;
    auVar9._12_2_ = uStack_322;
    auVar9._14_2_ = uStack_332;
    auVar9 = pmaddubsw(auVar9,auVar7);
    auVar8._2_2_ = CONCAT11(uStack_164,uStack_154);
    auVar8._0_2_ = uStack_110;
    auVar8._4_2_ = uStack_10e;
    auVar8._6_2_ = uStack_11e;
    auVar8._10_2_ = uStack_11c;
    auVar8._8_2_ = uStack_10c;
    auVar8._12_2_ = uStack_10a;
    auVar8._14_2_ = uStack_11a;
    auVar8 = pmaddubsw(auVar8,auVar7);
    auVar9 = phaddsw(auVar9,ZEXT816(0));
    auVar8 = phaddsw(auVar8,ZEXT816(0));
    auVar6._8_8_ = 0x20002000200020;
    auVar6._0_8_ = 0x20002000200020;
    auVar9 = paddsw(auVar9,auVar6);
    auVar5._8_8_ = 0x20002000200020;
    auVar5._0_8_ = 0x20002000200020;
    auVar8 = paddsw(auVar8,auVar5);
    auVar9 = psraw(auVar9,ZEXT416(6));
    auVar8 = psraw(auVar8,ZEXT416(6));
    local_3e8 = auVar9._0_2_;
    uStack_3e6 = auVar9._2_2_;
    uStack_3e4 = auVar9._4_2_;
    uStack_3e2 = auVar9._6_2_;
    local_548 = CONCAT13((0 < uStack_3e2) * (uStack_3e2 < 0x100) * auVar9[6] - (0xff < uStack_3e2),
                         CONCAT12((0 < uStack_3e4) * (uStack_3e4 < 0x100) * auVar9[4] -
                                  (0xff < uStack_3e4),
                                  CONCAT11((0 < uStack_3e6) * (uStack_3e6 < 0x100) * auVar9[2] -
                                           (0xff < uStack_3e6),
                                           (0 < local_3e8) * (local_3e8 < 0x100) * auVar9[0] -
                                           (0xff < local_3e8))));
    local_408 = auVar8._0_2_;
    uStack_406 = auVar8._2_2_;
    uStack_404 = auVar8._4_2_;
    uStack_402 = auVar8._6_2_;
    local_558 = CONCAT13((0 < uStack_402) * (uStack_402 < 0x100) * auVar8[6] - (0xff < uStack_402),
                         CONCAT12((0 < uStack_404) * (uStack_404 < 0x100) * auVar8[4] -
                                  (0xff < uStack_404),
                                  CONCAT11((0 < uStack_406) * (uStack_406 < 0x100) * auVar8[2] -
                                           (0xff < uStack_406),
                                           (0 < local_408) * (local_408 < 0x100) * auVar8[0] -
                                           (0xff < local_408))));
    local_420 = local_420 + in_RSI * 2;
    *local_430 = local_548;
    *(undefined4 *)((long)local_430 + in_RCX) = local_558;
    local_430 = (undefined4 *)(in_RCX * 2 + (long)local_430);
    local_508 = CONCAT17(uStack_151,
                         CONCAT16(uStack_155,
                                  CONCAT15(uStack_152,
                                           CONCAT14(uStack_156,
                                                    CONCAT13(uStack_153,
                                                             CONCAT12(uStack_157,
                                                                      CONCAT11(uStack_154,local_158)
                                                                     ))))));
    uStack_500 = CONCAT17(uStack_161,
                          CONCAT16(uStack_151,
                                   CONCAT15(uStack_162,
                                            CONCAT14(uStack_152,
                                                     CONCAT13(uStack_163,
                                                              CONCAT12(uStack_153,
                                                                       CONCAT11(uStack_164,
                                                                                uStack_154)))))));
    local_4a8 = uVar2;
  }
  return;
}

Assistant:

static void aom_filter_block1d4_v4_ssse3(
    const uint8_t *src_ptr, ptrdiff_t src_pitch, uint8_t *output_ptr,
    ptrdiff_t out_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m128i addFilterReg32;
  __m128i srcReg2, srcReg3, srcReg23, srcReg4, srcReg34, srcReg5, srcReg45,
      srcReg6, srcReg56;
  __m128i srcReg23_34_lo, srcReg45_56_lo;
  __m128i srcReg2345_3456_lo, srcReg2345_3456_hi;
  __m128i resReglo, resReghi;
  __m128i firstFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  addFilterReg32 = _mm_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  // converting the 16 bit (short) to  8 bit (byte) and have the
  // same data in both lanes of 128 bit register.
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);

  firstFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi32(0x5040302u));

  // multiple the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = out_pitch << 1;

  srcReg2 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 2));
  srcReg3 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 3));
  srcReg23 = _mm_unpacklo_epi32(srcReg2, srcReg3);

  srcReg4 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 4));

  // have consecutive loads on the same 256 register
  srcReg34 = _mm_unpacklo_epi32(srcReg3, srcReg4);

  srcReg23_34_lo = _mm_unpacklo_epi8(srcReg23, srcReg34);

  for (i = output_height; i > 1; i -= 2) {
    srcReg5 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 5));
    srcReg45 = _mm_unpacklo_epi32(srcReg4, srcReg5);

    srcReg6 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 6));
    srcReg56 = _mm_unpacklo_epi32(srcReg5, srcReg6);

    // merge every two consecutive registers
    srcReg45_56_lo = _mm_unpacklo_epi8(srcReg45, srcReg56);

    srcReg2345_3456_lo = _mm_unpacklo_epi16(srcReg23_34_lo, srcReg45_56_lo);
    srcReg2345_3456_hi = _mm_unpackhi_epi16(srcReg23_34_lo, srcReg45_56_lo);

    // multiply 2 adjacent elements with the filter and add the result
    resReglo = _mm_maddubs_epi16(srcReg2345_3456_lo, firstFilters);
    resReghi = _mm_maddubs_epi16(srcReg2345_3456_hi, firstFilters);

    resReglo = _mm_hadds_epi16(resReglo, _mm_setzero_si128());
    resReghi = _mm_hadds_epi16(resReghi, _mm_setzero_si128());

    // shift by 6 bit each 16 bit
    resReglo = _mm_adds_epi16(resReglo, addFilterReg32);
    resReghi = _mm_adds_epi16(resReghi, addFilterReg32);
    resReglo = _mm_srai_epi16(resReglo, 6);
    resReghi = _mm_srai_epi16(resReghi, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    resReglo = _mm_packus_epi16(resReglo, resReglo);
    resReghi = _mm_packus_epi16(resReghi, resReghi);

    src_ptr += src_stride;

    *((int *)(output_ptr)) = _mm_cvtsi128_si32(resReglo);
    *((int *)(output_ptr + out_pitch)) = _mm_cvtsi128_si32(resReghi);

    output_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg23_34_lo = srcReg45_56_lo;
    srcReg4 = srcReg6;
  }
}